

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConcatString.cpp
# Opt level: O0

void __thiscall
Js::ConcatStringBuilder::ConcatStringBuilder(ConcatStringBuilder *this,ConcatStringBuilder *other)

{
  charcount_t newLength;
  ScriptContext *this_00;
  JavascriptLibrary *this_01;
  StaticType *stringType;
  ConcatStringBuilder *other_local;
  ConcatStringBuilder *this_local;
  
  this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)other);
  this_01 = ScriptContext::GetLibrary(this_00);
  stringType = JavascriptLibrary::GetStringTypeStatic(this_01);
  ConcatStringBase::ConcatStringBase(&this->super_ConcatStringBase,stringType);
  (this->super_ConcatStringBase).super_LiteralString.super_JavascriptString.super_RecyclableObject.
  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject =
       (_func_int **)&PTR_Finalize_01dfd458;
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::JavascriptString>_>::WriteBarrierPtr
            (&this->m_slots);
  Memory::WriteBarrierPtr<Js::ConcatStringBuilder>::WriteBarrierPtr(&this->m_prevChunk);
  Memory::WriteBarrierPtr<Memory::WriteBarrierPtr<Js::JavascriptString>_>::operator=
            (&this->m_slots,&other->m_slots);
  this->m_count = other->m_count;
  this->m_slotCount = other->m_slotCount;
  Memory::WriteBarrierPtr<Js::ConcatStringBuilder>::operator=
            (&this->m_prevChunk,&other->m_prevChunk);
  newLength = JavascriptString::GetLength((JavascriptString *)other);
  JavascriptString::SetLength((JavascriptString *)this,newLength);
  return;
}

Assistant:

ConcatStringBuilder::ConcatStringBuilder(const ConcatStringBuilder& other):
        ConcatStringBase(other.GetScriptContext()->GetLibrary()->GetStringTypeStatic())
    {
        m_slots = other.m_slots;
        m_count = other.m_count;
        m_slotCount = other.m_slotCount;
        m_prevChunk = other.m_prevChunk;
        this->SetLength(other.GetLength());
        // TODO: should we copy the JavascriptString buffer and if so, how do we pass over the ownership?
    }